

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

void Curl_setup_transfer(Curl_easy *data,int sockindex,curl_off_t size,_Bool getheader,
                        int writesockindex)

{
  int *piVar1;
  connectdata *pcVar2;
  ushort uVar3;
  int iVar4;
  curl_socket_t cVar5;
  curl_socket_t cVar6;
  curltime cVar7;
  
  pcVar2 = data->conn;
  if ((((pcVar2->bits).field_0x7 & 4) == 0) && (pcVar2->httpversion != 0x14)) {
    cVar5 = -1;
    cVar6 = cVar5;
    if (sockindex != -1) {
      cVar6 = pcVar2->sock[sockindex];
    }
    pcVar2->sockfd = cVar6;
    if (writesockindex != -1) {
      cVar5 = pcVar2->sock[writesockindex];
    }
  }
  else {
    iVar4 = sockindex;
    if ((sockindex == -1) && (iVar4 = writesockindex, writesockindex == -1)) {
      cVar5 = -1;
    }
    else {
      cVar5 = pcVar2->sock[iVar4];
    }
    pcVar2->sockfd = cVar5;
  }
  pcVar2->writesockfd = cVar5;
  uVar3 = (ushort)*(undefined4 *)&(data->req).field_0x570;
  *(ushort *)&(data->req).field_0x570 = uVar3 & 0xff7f | (ushort)getheader << 7;
  (data->req).size = size;
  if ((!getheader) &&
     (((*(ushort *)&(data->req).field_0x570 = uVar3 & 0xff7e | (ushort)getheader << 7, size < 1 ||
       (Curl_pgrsSetDownloadSize(data,size), ((data->req).field_0x570 & 0x80) == 0)) &&
      (((data->set).field_0x913 & 0x10) != 0)))) {
    return;
  }
  if (sockindex != -1) {
    piVar1 = &(data->req).keepon;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  if (writesockindex != -1) {
    if (((data->state).field_0x515 & 1) != 0) {
      if (((pcVar2->handler->protocol & 3) != 0) &&
         (*(int *)((long)(data->req).protop + 0x210) == 2)) {
        (data->req).exp100 = EXP100_AWAITING_CONTINUE;
        cVar7 = Curl_now();
        (data->req).start100.tv_sec = cVar7.tv_sec;
        (data->req).start100.tv_usec = cVar7.tv_usec;
        Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
        return;
      }
      (data->req).exp100 = EXP100_SENDING_REQUEST;
    }
    piVar1 = &(data->req).keepon;
    *(byte *)piVar1 = (byte)*piVar1 | 2;
  }
  return;
}

Assistant:

void
Curl_setup_transfer(
  struct Curl_easy *data,   /* transfer */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  int writesockindex        /* socket index to write to, it may very well be
                               the same we read from. -1 disables */
  )
{
  struct SingleRequest *k = &data->req;
  struct connectdata *conn = data->conn;
  DEBUGASSERT(conn != NULL);
  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));

  if(conn->bits.multiplex || conn->httpversion == 20) {
    /* when multiplexing, the read/write sockets need to be the same! */
    conn->sockfd = sockindex == -1 ?
      ((writesockindex == -1 ? CURL_SOCKET_BAD : conn->sock[writesockindex])) :
      conn->sock[sockindex];
    conn->writesockfd = conn->sockfd;
  }
  else {
    conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
    conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD:conn->sock[writesockindex];
  }
  k->getheader = getheader;

  k->size = size;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then don't do this! */
  if(k->getheader || !data->set.opt_no_body) {

    if(sockindex != -1)
      k->keepon |= KEEP_RECV;

    if(writesockindex != -1) {
      struct HTTP *http = data->req.protop;
      /* HTTP 1.1 magic:

         Even if we require a 100-return code before uploading data, we might
         need to write data before that since the REQUEST may not have been
         finished sent off just yet.

         Thus, we must check if the request has been sent before we set the
         state info where we wait for the 100-return code
      */
      if((data->state.expect100header) &&
         (conn->handler->protocol&PROTO_FAMILY_HTTP) &&
         (http->sending == HTTPSEND_BODY)) {
        /* wait with write until we either got 100-continue or a timeout */
        k->exp100 = EXP100_AWAITING_CONTINUE;
        k->start100 = Curl_now();

        /* Set a timeout for the multi interface. Add the inaccuracy margin so
           that we don't fire slightly too early and get denied to run. */
        Curl_expire(data, data->set.expect_100_timeout, EXPIRE_100_TIMEOUT);
      }
      else {
        if(data->state.expect100header)
          /* when we've sent off the rest of the headers, we must await a
             100-continue but first finish sending the request */
          k->exp100 = EXP100_SENDING_REQUEST;

        /* enable the write bit when we're not waiting for continue */
        k->keepon |= KEEP_SEND;
      }
    } /* if(writesockindex != -1) */
  } /* if(k->getheader || !data->set.opt_no_body) */

}